

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare256_avx2.c
# Opt level: O0

uint32_t compare256_avx2(uint8_t *src0,uint8_t *src1)

{
  uint32_t uVar1;
  uint8_t *in_stack_00000068;
  uint8_t *in_stack_00000070;
  
  uVar1 = compare256_avx2_static(in_stack_00000070,in_stack_00000068);
  return uVar1;
}

Assistant:

Z_INTERNAL uint32_t compare256_avx2(const uint8_t *src0, const uint8_t *src1) {
    return compare256_avx2_static(src0, src1);
}